

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O1

void __thiscall KktChStep::printA(KktChStep *this)

{
  char *pcVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  undefined8 in_RAX;
  size_t sVar7;
  long lVar8;
  ostream *poVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  char buff [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
  if (0 < this->numCol) {
    lVar12 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      sprintf(pcVar1,"%2.1g ",
              (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar7 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar7);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------A-|-b-----\n",0x11);
  if (0 < this->numRow) {
    uVar13 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      if (0 < this->numCol) {
        lVar12 = 0;
        do {
          piVar3 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar10 = piVar3[lVar12];
          lVar8 = (long)iVar10;
          bVar14 = uVar13 == (uint)piVar4[lVar8];
          if (bVar14) {
LAB_00152893:
            if (piVar3[lVar12 + 1] <= iVar10) goto LAB_001528d9;
            sprintf(pcVar1,"%2.1g ",
                    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8]);
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar7 = strlen(pcVar1);
            pcVar11 = pcVar1;
          }
          else {
            iVar2 = piVar3[lVar12 + 1];
            iVar5 = iVar2;
            if (iVar2 < iVar10) {
              iVar5 = iVar10;
            }
            if (iVar10 < iVar2) {
              do {
                iVar10 = iVar10 + 1;
                lVar6 = lVar8 + 1;
                lVar8 = lVar8 + 1;
                bVar14 = uVar13 == (uint)piVar4[lVar6];
                if (bVar14) goto LAB_00152893;
              } while (iVar5 != lVar8);
            }
            iVar10 = (int)lVar8;
            if (bVar14) goto LAB_00152893;
LAB_001528d9:
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar7 = 3;
            pcVar11 = "   ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar7);
          lVar12 = lVar12 + 1;
        } while (lVar12 < this->numCol);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |   ",6);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      poVar9 = std::ostream::_M_insert<double>
                         ((this->RrowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar13]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," < < ",5);
      poVar9 = std::ostream::_M_insert<double>
                         ((this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar13]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)this->numRow);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------l------\n",0xe);
  if (0 < this->numCol) {
    lVar12 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] <= -1e+200) {
        uStack_38 = CONCAT44(0x666e692d,(undefined4)uStack_38);
      }
      else {
        sprintf(pcVar1,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar7 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar7);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------u------\n",0xe);
  if (0 < this->numCol) {
    lVar12 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      if (1e+200 <= (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12]) {
        uStack_38 = CONCAT44(0x666e69,(undefined4)uStack_38);
      }
      else {
        sprintf(pcVar1,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar7 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar7);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void KktChStep::printA() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------A-|-b-----\n";
	for (int i=0;i<numRow;i++) {
		for (int j=0;j<numCol;j++) {

			int ind = Astart[j];
			while (Aindex[ind]!=i && ind<Astart[j+1]) 
				ind++;
			//if a_ij is nonzero print
			if (Aindex[ind]==i && ind<Astart[j+1])
			{	
				sprintf(buff, "%2.1g ", Avalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
	}
	cout<<"------l------\n";
	for (int i=0;i<numCol;i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else 
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<numCol;i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else 
			sprintf(buff, "inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;

}